

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_ip_array_list.cc
# Opt level: O0

void anon_unknown.dwarf_ca97b::Json2Type
               (Value *value,RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_78;
  string local_58;
  string local_38;
  RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType *local_18;
  RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType *)value;
  bVar1 = Json::Value::isMember(value,"DBInstanceIPArrayName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DBInstanceIPArrayName");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceIPArrayAttribute");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DBInstanceIPArrayAttribute");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=
              ((string *)&local_18->db_instance_ip_array_attribute,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"SecurityIPList");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"SecurityIPList");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->security_ip_list,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType* item) {
  if(value.isMember("DBInstanceIPArrayName")) {
    item->db_instance_ip_array_name = value["DBInstanceIPArrayName"].asString();
  }
  if(value.isMember("DBInstanceIPArrayAttribute")) {
    item->db_instance_ip_array_attribute = value["DBInstanceIPArrayAttribute"].asString();
  }
  if(value.isMember("SecurityIPList")) {
    item->security_ip_list = value["SecurityIPList"].asString();
  }
}